

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformRotateKHR
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int32_t iVar5;
  Instruction *pIVar6;
  long lVar7;
  char *pcVar8;
  uint64_t cluster_size;
  ulong local_208;
  DiagnosticStream local_200;
  
  uVar4 = (inst->inst_).type_id;
  bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,uVar4);
  if (((!bVar1) && (bVar1 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar4), !bVar1)) &&
     (bVar1 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar4), !bVar1)) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar8 = 
    "Expected Result Type to be a scalar or vector of floating-point, integer or boolean type.";
    lVar7 = 0x59;
    goto LAB_00689066;
  }
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,3);
  uVar3 = ValidationState_t::GetTypeId(_,uVar2);
  if (uVar3 == uVar4) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    uVar4 = ValidationState_t::GetTypeId(_,uVar2);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar4);
    if (!bVar1) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = "Delta must be a scalar of integer type, whose Signedness operand is 0.";
      lVar7 = 0x46;
      goto LAB_00689066;
    }
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x19) {
      return SPV_SUCCESS;
    }
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    pIVar6 = ValidationState_t::FindDef(_,uVar2);
    if ((pIVar6 == (Instruction *)0x0) ||
       (bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,(pIVar6->inst_).type_id), !bVar1)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = "ClusterSize must be a scalar of integer type, whose Signedness operand is 0.";
      lVar7 = 0x4c;
      goto LAB_00689066;
    }
    iVar5 = spvOpcodeIsConstant((uint)(pIVar6->inst_).opcode);
    if (iVar5 != 0) {
      bVar1 = ValidationState_t::EvalConstantValUint64(_,uVar2,&local_208);
      if (!bVar1) {
        return SPV_SUCCESS;
      }
      if (local_208 - 1 < (local_208 ^ local_208 - 1)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_WARNING,inst);
      pcVar8 = "Behavior is undefined unless ClusterSize is at least 1 and a power of 2.";
      lVar7 = 0x48;
      goto LAB_00689066;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar8 = "ClusterSize must come from a constant instruction.";
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar8 = "Result Type must be the same as the type of Value.";
  }
  lVar7 = 0x32;
LAB_00689066:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar8,lVar7);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateGroupNonUniformRotateKHR(ValidationState_t& _,
                                              const Instruction* inst) {
  // Scope is already checked by ValidateExecutionScope() above.
  const uint32_t result_type = inst->type_id();
  if (!_.IsIntScalarOrVectorType(result_type) &&
      !_.IsFloatScalarOrVectorType(result_type) &&
      !_.IsBoolScalarOrVectorType(result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be a scalar or vector of "
              "floating-point, integer or boolean type.";
  }

  const uint32_t value_type = _.GetTypeId(inst->GetOperandAs<uint32_t>(3));
  if (value_type != result_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result Type must be the same as the type of Value.";
  }

  const uint32_t delta_type = _.GetTypeId(inst->GetOperandAs<uint32_t>(4));
  if (!_.IsUnsignedIntScalarType(delta_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Delta must be a scalar of integer type, whose Signedness "
              "operand is 0.";
  }

  if (inst->words().size() > 6) {
    const uint32_t cluster_size_op_id = inst->GetOperandAs<uint32_t>(5);
    const Instruction* cluster_size_inst = _.FindDef(cluster_size_op_id);
    if (!cluster_size_inst ||
        !_.IsUnsignedIntScalarType(cluster_size_inst->type_id())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ClusterSize must be a scalar of integer type, whose "
                "Signedness operand is 0.";
    }

    if (!spvOpcodeIsConstant(cluster_size_inst->opcode())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ClusterSize must come from a constant instruction.";
    }

    uint64_t cluster_size;
    const bool valid_const =
        _.EvalConstantValUint64(cluster_size_op_id, &cluster_size);
    if (valid_const &&
        ((cluster_size == 0) || ((cluster_size & (cluster_size - 1)) != 0))) {
      return _.diag(SPV_WARNING, inst)
             << "Behavior is undefined unless ClusterSize is at least 1 and a "
                "power of 2.";
    }

    // TODO(kpet) Warn about undefined behavior when ClusterSize is greater than
    // the declared SubGroupSize
  }

  return SPV_SUCCESS;
}